

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<short,short>(Thread *this,BinopFunc<short,_short> *f)

{
  short sVar1;
  Simd<short,_(unsigned_char)__b_> SVar2;
  byte local_49;
  undefined8 uStack_48;
  u8 i;
  SR result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  BinopFunc<short,_short> *f_local;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  SVar2 = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  result.v[4] = SVar2.v[0];
  result.v[5] = SVar2.v[1];
  result.v[6] = SVar2.v[2];
  result.v[7] = SVar2.v[3];
  lhs.v[0] = SVar2.v[4];
  lhs.v[1] = SVar2.v[5];
  lhs.v[2] = SVar2.v[6];
  lhs.v[3] = SVar2.v[7];
  for (local_49 = 0; local_49 < 8; local_49 = local_49 + 1) {
    sVar1 = (*f)(result.v[(ulong)local_49 + 4],lhs.v[(ulong)local_49 + 4]);
    lhs.v[(ulong)local_49 - 0xc] = sVar1;
  }
  SVar2.v[4] = result.v[0];
  SVar2.v[5] = result.v[1];
  SVar2.v[6] = result.v[2];
  SVar2.v[7] = result.v[3];
  SVar2.v._0_8_ = uStack_48;
  Push<wabt::interp::Simd<short,(unsigned_char)8>>(this,SVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}